

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# frm_driver.c
# Opt level: O2

int IFN_End_Of_Field(FORM *form)

{
  FIELD *pFVar1;
  char *pcVar2;
  
  pFVar1 = form->current;
  Synchronize_Buffer(form);
  pcVar2 = After_End_Of_Data(pFVar1->buf,pFVar1->dcols * pFVar1->drows);
  Adjust_Cursor_Position
            (form,pcVar2 + -(ulong)(pcVar2 ==
                                   pFVar1->buf + (long)pFVar1->dcols * (long)pFVar1->drows));
  return 0;
}

Assistant:

static int IFN_End_Of_Field(FORM * form)
{
  FIELD *field = form->current;
  char *pos;

  Synchronize_Buffer(form);
  pos = After_End_Of_Data(field->buf,Buffer_Length(field));
  if (pos==(field->buf + Buffer_Length(field)))
    pos--;
  Adjust_Cursor_Position(form,pos);
  return(E_OK);
}